

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_expectOneIntegerParameterAndFailsDueToParameterName_Test::
~TEST_MockParameterTest_expectOneIntegerParameterAndFailsDueToParameterName_Test
          (TEST_MockParameterTest_expectOneIntegerParameterAndFailsDueToParameterName_Test *this)

{
  TEST_MockParameterTest_expectOneIntegerParameterAndFailsDueToParameterName_Test *this_local;
  
  ~TEST_MockParameterTest_expectOneIntegerParameterAndFailsDueToParameterName_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockParameterTest, expectOneIntegerParameterAndFailsDueToParameterName)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withParameter("parameter", 10);
    MockNamedValue parameter("different");
    parameter.setValue(10);
    MockUnexpectedInputParameterFailure expectedFailure(mockFailureTest(), "foo", parameter, expectations);

    mock().expectOneCall("foo").withParameter("parameter", 10);
    mock().actualCall("foo").withParameter("different", 10);

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}